

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  sqlite3_module *psVar1;
  Fts5Sorter *pFVar2;
  Fts5Expr *pFVar3;
  Fts5ExprPhrase **ppFVar4;
  long *plVar5;
  Fts5Colset *pFVar6;
  Fts5ExprPhrase *pFVar7;
  int iVar8;
  int iVar9;
  Fts5Sorter *pSorter;
  void *__s;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int n;
  char *z;
  int local_64;
  u8 **local_60;
  int *local_58;
  char *local_50;
  Fts5Expr *local_48;
  void *local_40;
  long local_38;
  
  psVar1 = (pCsr->base).pVtab[1].pModule;
  iVar9 = 0;
  if ((pCsr->csrflags & 0x40) != 0) {
    if (*(int *)((long)&psVar1->xColumn + 4) == 0) {
      iVar9 = 0;
    }
    else {
      pFVar2 = pCsr->pSorter;
      pFVar3 = pCsr->pExpr;
      iVar9 = pFVar3->nPhrase;
      local_60 = pa;
      local_58 = pn;
      iVar8 = sqlite3_initialize();
      if (iVar8 == 0) {
        __s = sqlite3Malloc((long)iVar9 << 4);
      }
      else {
        __s = (void *)0x0;
      }
      if (__s == (void *)0x0) {
        iVar9 = 7;
      }
      else {
        iVar9 = 0;
        memset(__s,0,(long)pFVar3->nPhrase << 4);
        iVar8 = pFVar3->nPhrase;
        if (0 < (long)iVar8) {
          ppFVar4 = pFVar3->apExprPhrase;
          lVar10 = 0;
          do {
            plVar5 = *(long **)((long)ppFVar4 + lVar10);
            if ((pFVar2 == (Fts5Sorter *)0x0) &&
               ((((int)plVar5[2] == 0 || (*(long *)(*plVar5 + 0x18) != pFVar3->pRoot->iRowid)) ||
                (*(int *)(*plVar5 + 4) != 0)))) {
              *(undefined4 *)((long)__s + lVar10 * 2 + 0xc) = 1;
            }
            else {
              *(undefined4 *)(plVar5 + 2) = 0;
            }
            lVar10 = lVar10 + 8;
          } while ((long)iVar8 * 8 != lVar10);
          iVar9 = 0;
        }
      }
      if ((0 < *(int *)&psVar1->xBestIndex) && (__s != (void *)0x0)) {
        uVar11 = 0;
        do {
          iVar9 = fts5ApiColumnText((Fts5Context *)pCsr,(int)uVar11,&local_50,&local_64);
          if (iVar9 == 0) {
            local_48 = pCsr->pExpr;
            local_38 = (uVar11 << 0x20) + -1;
            iVar9 = local_48->nPhrase;
            if (0 < (long)iVar9) {
              ppFVar4 = local_48->apExprPhrase;
              lVar10 = 0;
              do {
                pFVar6 = ppFVar4[lVar10]->pNode->pNear->pColset;
                if (pFVar6 == (Fts5Colset *)0x0) {
LAB_001d13b9:
                  if (*(int *)((long)__s + lVar10 * 0x10 + 0xc) != 0) goto LAB_001d13c8;
                  *(undefined4 *)((long)__s + lVar10 * 0x10 + 8) = 1;
                }
                else {
                  if (0 < (long)pFVar6->nCol) {
                    lVar12 = 0;
                    do {
                      if (uVar11 == (uint)pFVar6->aiCol[lVar12]) goto LAB_001d13b9;
                      lVar12 = lVar12 + 1;
                    } while (pFVar6->nCol != lVar12);
                  }
LAB_001d13c8:
                  *(undefined4 *)((long)__s + lVar10 * 0x10 + 8) = 0;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != iVar9);
            }
            local_40 = __s;
            if (local_50 == (char *)0x0) {
              iVar9 = 0;
            }
            else {
              iVar9 = (**(code **)(psVar1->xBegin + 0x10))
                                (psVar1->xUpdate,&local_48,4,local_50,local_64,
                                 fts5ExprPopulatePoslistsCb);
            }
          }
          uVar11 = uVar11 + 1;
        } while (((long)uVar11 < (long)*(int *)&psVar1->xBestIndex) && (iVar9 == 0));
      }
      sqlite3_free(__s);
      pn = local_58;
      pa = local_60;
      if (pCsr->pSorter != (Fts5Sorter *)0x0) {
        fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
        pn = local_58;
        pa = local_60;
      }
    }
    *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
  }
  pFVar2 = pCsr->pSorter;
  if ((pFVar2 == (Fts5Sorter *)0x0) || (*(int *)((long)&psVar1->xColumn + 4) != 0)) {
    pFVar7 = pCsr->pExpr->apExprPhrase[iPhrase];
    if ((pFVar7->pNode->bEof == 0) && (pFVar7->pNode->iRowid == pCsr->pExpr->pRoot->iRowid)) {
      *pa = (pFVar7->poslist).p;
      iVar8 = (pFVar7->poslist).n;
    }
    else {
      *pa = (u8 *)0x0;
      iVar8 = 0;
    }
    *pn = iVar8;
  }
  else {
    if (iPhrase == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = pFVar2->aIdx[(long)iPhrase + -1];
    }
    *pn = pFVar2->aIdx[iPhrase] - iVar8;
    *pa = pFVar2->aPoslist + iVar8;
  }
  return iVar9;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr, 
  int iPhrase, 
  const u8 **pa,
  int *pn
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){

    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;
      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        int n; const char *z;
        rc = fts5ApiColumnText((Fts5Context*)pCsr, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
    *pn = pSorter->aIdx[iPhrase] - i1;
    *pa = &pSorter->aPoslist[i1];
  }else{
    *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
  }

  return rc;
}